

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O1

int nni_taskq_init(nni_taskq **tqp,int nthr)

{
  nni_mtx *mtx;
  int iVar1;
  nni_taskq *tq;
  nni_taskq_thr *pnVar2;
  undefined8 *arg;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  int local_34;
  
  tq = (nni_taskq *)nni_zalloc(0xc0);
  iVar1 = 2;
  if (tq != (nni_taskq *)0x0) {
    pnVar2 = (nni_taskq_thr *)nni_zalloc((long)nthr * 0xa0);
    tq->tq_threads = pnVar2;
    if (pnVar2 == (nni_taskq_thr *)0x0) {
      nni_free(tq,0xc0);
    }
    else {
      tq->tq_nthreads = nthr;
      nni_list_init_offset((nni_list *)tq,0);
      mtx = &tq->tq_mtx;
      nni_mtx_init(mtx);
      nni_cv_init(&tq->tq_sched_cv,mtx);
      nni_cv_init(&tq->tq_wait_cv,mtx);
      bVar6 = 0 < nthr;
      if (0 < nthr) {
        lVar4 = 8;
        uVar3 = 1;
        do {
          pnVar2 = tq->tq_threads;
          arg = (undefined8 *)((long)pnVar2 + lVar4 + -8);
          *arg = tq;
          iVar1 = nni_thr_init((nni_thr *)((long)&pnVar2->tqt_tq + lVar4),nni_taskq_thread,arg);
          if (iVar1 != 0) {
            nni_taskq_fini(tq);
            local_34 = iVar1;
            break;
          }
          bVar6 = uVar3 < (uint)nthr;
          lVar4 = lVar4 + 0xa0;
          bVar7 = uVar3 != (uint)nthr;
          uVar3 = uVar3 + 1;
        } while (bVar7);
      }
      iVar1 = local_34;
      if (!bVar6) {
        tq->tq_run = true;
        if (0 < tq->tq_nthreads) {
          lVar4 = 8;
          lVar5 = 0;
          do {
            nni_thr_run((nni_thr *)((long)&tq->tq_threads->tqt_tq + lVar4));
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0xa0;
          } while (lVar5 < tq->tq_nthreads);
        }
        *tqp = tq;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
nni_taskq_init(nni_taskq **tqp, int nthr)
{
	nni_taskq *tq;

	if ((tq = NNI_ALLOC_STRUCT(tq)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((tq->tq_threads = NNI_ALLOC_STRUCTS(tq->tq_threads, nthr)) ==
	    NULL) {
		NNI_FREE_STRUCT(tq);
		return (NNG_ENOMEM);
	}
	tq->tq_nthreads = nthr;
	NNI_LIST_INIT(&tq->tq_tasks, nni_task, task_node);

	nni_mtx_init(&tq->tq_mtx);
	nni_cv_init(&tq->tq_sched_cv, &tq->tq_mtx);
	nni_cv_init(&tq->tq_wait_cv, &tq->tq_mtx);

	for (int i = 0; i < nthr; i++) {
		int rv;
		tq->tq_threads[i].tqt_tq = tq;
		rv = nni_thr_init(&tq->tq_threads[i].tqt_thread,
		    nni_taskq_thread, &tq->tq_threads[i]);
		if (rv != 0) {
			nni_taskq_fini(tq);
			return (rv);
		}
	}
	tq->tq_run = true;
	for (int i = 0; i < tq->tq_nthreads; i++) {
		nni_thr_run(&tq->tq_threads[i].tqt_thread);
	}
	*tqp = tq;
	return (0);
}